

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O2

int __thiscall Procedure::getValue(Procedure *this,string *name,int *val)

{
  pointer pDVar1;
  __type _Var2;
  ulong uVar3;
  long lVar4;
  int i;
  ulong uVar5;
  
  lVar4 = 0;
  uVar5 = 0;
  do {
    pDVar1 = (this->nameTable).super__Vector_base<Description,_std::allocator<Description>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar3 = ((long)(this->nameTable).super__Vector_base<Description,_std::allocator<Description>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0x30;
    if (uVar3 <= uVar5) {
LAB_0010afe4:
      return (uVar5 < uVar3) - 1;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pDVar1->name)._M_dataplus._M_p + lVar4),name);
    if ((_Var2) &&
       (pDVar1 = (this->nameTable).super__Vector_base<Description,_std::allocator<Description>_>.
                 _M_impl.super__Vector_impl_data._M_start,
       *(int *)((long)&pDVar1->kind + lVar4) == 0)) {
      *val = *(int *)((long)&pDVar1->val + lVar4);
      goto LAB_0010afe4;
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x30;
  } while( true );
}

Assistant:

int getValue(const std::string &name, int &val) {
		for (auto i = 0; i < nameTable.size(); i++) {
			if (nameTable[i].name == name) {
				if (nameTable[i].kind != 0) continue;
				val = nameTable[i].val;
				return 0;
			}
		}
		return -1;
	}